

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreqFlucCorrFunc.cpp
# Opt level: O0

int __thiscall
OpenMD::FreqFlucCorrFunc::computeProperty1(FreqFlucCorrFunc *this,int frame,StuntDouble *sd)

{
  bool bVar1;
  reference this_00;
  size_type sVar2;
  Atom *in_RDX;
  int in_ESI;
  Vector<double,_3U> *in_RDI;
  value_type_conflict *__x;
  RealType uedot;
  MultipoleAdapter ma;
  AtomType *at;
  Vector3d u;
  Vector3d e;
  Vector3<double> *in_stack_ffffffffffffff08;
  StuntDouble *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  RectMatrix<double,_3U,_3U> *in_stack_ffffffffffffff28;
  MultipoleAdapter local_c8;
  AtomType *local_c0;
  MultipoleAdapter *in_stack_ffffffffffffff78;
  
  StuntDouble::getElectricField(in_stack_ffffffffffffff18);
  Vector3<double>::Vector3((Vector3<double> *)0x156ffd);
  bVar1 = StuntDouble::isRigidBody(&in_RDX->super_StuntDouble);
  if (bVar1) {
    StuntDouble::getA(in_stack_ffffffffffffff18);
    RectMatrix<double,_3U,_3U>::getRow(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
    Vector3<double>::operator=((Vector3<double> *)in_stack_ffffffffffffff18,in_RDI);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x15705f);
  }
  else {
    local_c0 = Atom::getAtomType(in_RDX);
    MultipoleAdapter::MultipoleAdapter(&local_c8,local_c0);
    bVar1 = MultipoleAdapter::isDipole(in_stack_ffffffffffffff78);
    if (bVar1) {
      StuntDouble::getDipole(in_stack_ffffffffffffff18);
      Vector3<double>::operator=((Vector3<double> *)in_RDI,in_stack_ffffffffffffff08);
    }
  }
  __x = (value_type_conflict *)
        dot<double,3u>((Vector<double,_3U> *)
                       CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (Vector<double,_3U> *)in_stack_ffffffffffffff18);
  Utils::Accumulator<double>::add
            ((Accumulator<double> *)(in_RDI + 0x99),(double *)&stack0xffffffffffffff18);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)(in_RDI + 0x98),(long)in_ESI);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),__x);
  this_00 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)(in_RDI + 0x98),(long)in_ESI);
  sVar2 = std::vector<double,_std::allocator<double>_>::size(this_00);
  return (int)sVar2 + -1;
}

Assistant:

int FreqFlucCorrFunc::computeProperty1(int frame, StuntDouble* sd) {
    Vector3d e = sd->getElectricField();
    Vector3d u;
    if (sd->isRigidBody()) {
      u = sd->getA().getRow(2);
    } else {
      AtomType* at        = static_cast<Atom*>(sd)->getAtomType();
      MultipoleAdapter ma = MultipoleAdapter(at);

      if (ma.isDipole()) { u = sd->getDipole(); }
    }

    RealType uedot = dot(u, e);
    ueStats_.add(uedot);

    ue_[frame].push_back(uedot);
    return ue_[frame].size() - 1;
  }